

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

void __thiscall
DataSourceDOS::SpriteDosOverlay::SpriteDosOverlay
          (SpriteDosOverlay *this,PBuffer *_data,ColorDOS *palette,uchar value)

{
  uchar value_00;
  undefined1 value_01;
  undefined1 value_02;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint8_t *puVar5;
  uchar local_7c;
  uchar uStack_7b;
  ColorDOS color;
  ulong uStack_78;
  size_t i;
  size_t fill;
  size_t drop;
  undefined1 local_58 [8];
  PMutableBuffer result;
  shared_ptr<Buffer> local_38;
  byte local_21;
  ColorDOS *pCStack_20;
  uchar value_local;
  ColorDOS *palette_local;
  PBuffer *_data_local;
  SpriteDosOverlay *this_local;
  
  local_21 = value;
  pCStack_20 = palette;
  palette_local = (ColorDOS *)_data;
  _data_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_38,_data);
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_38);
  std::shared_ptr<Buffer>::~shared_ptr(&local_38);
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_001a4e98;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)local_58);
  while( true ) {
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar1 = Buffer::readable(peVar3);
    if (!bVar1) break;
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar2 = Buffer::pop<unsigned_char>(peVar3);
    peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    MutableBuffer::push<unsigned_int>(peVar4,0,(ulong)bVar2);
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar2 = Buffer::pop<unsigned_char>(peVar3);
    for (uStack_78 = 0; uStack_78 < bVar2; uStack_78 = uStack_78 + 1) {
      value_00 = pCStack_20[local_21].b;
      value_01 = pCStack_20[local_21].r;
      value_02 = pCStack_20[local_21].g;
      peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar4,value_00,1);
      peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar4,value_02,1);
      peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar4,value_01,1);
      peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar4,local_21,1);
    }
  }
  peVar4 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  puVar5 = (uint8_t *)MutableBuffer::unfix(peVar4);
  (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
  std::shared_ptr<MutableBuffer>::~shared_ptr((shared_ptr<MutableBuffer> *)local_58);
  return;
}

Assistant:

DataSourceDOS::SpriteDosOverlay::SpriteDosOverlay(PBuffer _data,
                                                  ColorDOS *palette,
                                                  unsigned char value)
  : SpriteBaseDOS(_data) {
  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    size_t drop = _data->pop<uint8_t>();
    result->push<uint32_t>(0x00000000, drop);

    size_t fill = _data->pop<uint8_t>();
    for (size_t i = 0; i < fill; i++) {
      ColorDOS color = palette[value];
      result->push<uint8_t>(color.b);  // Blue
      result->push<uint8_t>(color.g);  // Green
      result->push<uint8_t>(color.r);  // Red
      result->push<uint8_t>(value);    // Alpha
    }
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}